

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void Search::foreach_action_from_cache(search_private *priv,size_t t,action override_a)

{
  v_array<Search::action_cache> *this;
  v_array<Search::action_cache> **ppvVar1;
  size_t sVar2;
  action_cache *paVar3;
  action in_EDX;
  size_t in_RSI;
  long in_RDI;
  action_cache *ac;
  size_t id;
  v_array<Search::action_cache> *cached;
  byte local_59;
  ulong local_28;
  
  ppvVar1 = v_array<v_array<Search::action_cache>_*>::operator[]
                      ((v_array<v_array<Search::action_cache>_*> *)(in_RDI + 0x668),in_RSI);
  this = *ppvVar1;
  if (this != (v_array<Search::action_cache> *)0x0) {
    for (local_28 = 0; sVar2 = v_array<Search::action_cache>::size(this), local_28 < sVar2;
        local_28 = local_28 + 1) {
      paVar3 = v_array<Search::action_cache>::operator[](this,local_28);
      if (in_EDX == 0xffffffff) {
        local_59 = paVar3->is_opt;
      }
      else {
        local_59 = paVar3->k == in_EDX;
      }
      (**(code **)(*(long *)(in_RDI + 0x658) + 0x18))
                (paVar3->min_cost,paVar3->cost,**(undefined8 **)(in_RDI + 0x658),
                 in_RSI - *(long *)(in_RDI + 0x660),paVar3->k,local_59 & 1);
    }
  }
  return;
}

Assistant:

void foreach_action_from_cache(search_private& priv, size_t t, action override_a = (action)-1)
{
  cdbg << "foreach_action_from_cache: t=" << t << ", memo_foreach_action.size()=" << priv.memo_foreach_action.size()
       << ", override_a=" << override_a << endl;
  assert(t < priv.memo_foreach_action.size());
  v_array<action_cache>* cached = priv.memo_foreach_action[t];
  if (!cached)
    return;  // the only way this can happen is if the metatask overrode this action
  cdbg << "memo_foreach_action size = " << cached->size() << endl;
  for (size_t id = 0; id < cached->size(); id++)
  {
    action_cache& ac = (*cached)[id];
    priv.metaoverride->_foreach_action(*priv.metaoverride->sch, t - priv.meta_t, ac.min_cost, ac.k,
        (override_a == (action)-1) ? ac.is_opt : (ac.k == override_a), ac.cost);
  }
}